

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubicLattice.cpp
# Opt level: O0

int __thiscall
CubicLattice::neighbour(CubicLattice *this,int vertexIndex,string *direction,int sign)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  invalid_argument *piVar4;
  ostream *poVar5;
  int in_ECX;
  long in_RDI;
  cartesian4 cVar6;
  string errorMessage;
  string errorDir;
  cartesian4 errorCoord;
  ostringstream stream;
  cartesian4 coordinate;
  cartesian4 *in_stack_fffffffffffffd48;
  ostream *in_stack_fffffffffffffd50;
  cartesian4 *in_stack_fffffffffffffd68;
  Lattice *in_stack_fffffffffffffd70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffd98;
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  cartesian4 local_1d8;
  ostringstream local_1c8 [380];
  cartesian4 local_4c;
  undefined8 local_3c;
  undefined8 local_34;
  int local_1c;
  
  if ((in_ECX != 1) && (in_ECX != -1)) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Sign must be either 1 or -1.");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_1c = in_ECX;
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48);
  if (((!bVar2) &&
      (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48), !bVar2)
      ) && (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48),
           !bVar2)) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar4,"Direction must be one of \'x\', \'y\' or \'z\'.");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  cVar6 = Lattice::indexToCoordinate
                    (in_stack_fffffffffffffd70,(int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
  local_4c._0_8_ = cVar6._0_8_;
  local_3c._0_4_ = local_4c.x;
  local_3c._4_4_ = local_4c.y;
  local_4c._8_8_ = cVar6._8_8_;
  local_34._0_4_ = local_4c.z;
  local_34._4_4_ = local_4c.w;
  uVar1 = local_34;
  local_34._4_4_ = cVar6.w;
  local_4c = cVar6;
  local_34 = uVar1;
  if (local_34._4_4_ == 1) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Cubic lattice doesn\'t contain w=0 vertices.");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48);
  if (bVar2) {
    local_3c = CONCAT44(local_3c._4_4_,(int)local_3c + local_1c);
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48);
    if (bVar2) {
      local_3c = CONCAT44(local_3c._4_4_ + local_1c,(int)local_3c);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48);
      if (bVar2) {
        local_34 = CONCAT44(local_34._4_4_,(int)local_34 + local_1c);
      }
    }
  }
  if ((((-1 < (int)local_3c) && ((int)local_3c < *(int *)(in_RDI + 8))) &&
      ((-1 < local_3c && ((local_3c._4_4_ < *(int *)(in_RDI + 8) && (-1 < (int)local_34)))))) &&
     ((int)local_34 < *(int *)(in_RDI + 8))) {
    iVar3 = Lattice::coordinateToIndex(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    return iVar3;
  }
  std::__cxx11::ostringstream::ostringstream(local_1c8);
  local_1d8 = Lattice::indexToCoordinate
                        (in_stack_fffffffffffffd70,(int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
  std::__cxx11::string::string(local_1f8);
  if (local_1c == 1) {
    std::operator+(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    std::__cxx11::string::operator=(local_1f8,local_218);
    std::__cxx11::string::~string(local_218);
  }
  else if (local_1c == -1) {
    std::operator+(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    std::__cxx11::string::operator=(local_1f8,local_238);
    std::__cxx11::string::~string(local_238);
  }
  poVar5 = std::operator<<((ostream *)local_1c8,"CubicLattice::neighbour, ");
  poVar5 = std::operator<<(poVar5,local_1f8);
  std::operator<<(poVar5," neighbour of ");
  poVar5 = operator<<(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  std::operator<<(poVar5," is outside the lattice.");
  std::__cxx11::ostringstream::str();
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar4,local_258);
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int CubicLattice::neighbour(const int vertexIndex, const std::string &direction, const int sign)
{
    if (!(sign == 1 || sign == -1))
    {
        throw std::invalid_argument("Sign must be either 1 or -1.");
    }
    if (!(direction == "x" || direction == "y" || direction == "z"))
    {
        throw std::invalid_argument("Direction must be one of 'x', 'y' or 'z'.");
    }
    cartesian4 coordinate;
    coordinate = indexToCoordinate(vertexIndex);
    if (coordinate.w == 1)
    {
        throw std::invalid_argument("Cubic lattice doesn't contain w=0 vertices.");
    }
    else
    {
        if (direction == "x")
        {
            coordinate.x = coordinate.x + sign;
        }
        else if (direction == "y")
        {
            coordinate.y = coordinate.y + sign;
        }
        else if (direction == "z")
        {
            coordinate.z = coordinate.z + sign;
        }
    }
    if (coordinate.x < 0 || coordinate.x >= l || coordinate.y < 0 || coordinate.y >= l || coordinate.z < 0 || coordinate.z >= l)
    {
        std::ostringstream stream;
        cartesian4 errorCoord = indexToCoordinate(vertexIndex);
        std::string errorDir;
        if (sign == 1)
        {
            errorDir = "+" + direction;
        }
        else if (sign == -1)
        {
            errorDir = "-" + direction;
        }
        stream << "CubicLattice::neighbour, " << errorDir << " neighbour of " << errorCoord << " is outside the lattice.";
        std::string errorMessage = stream.str();
        throw std::invalid_argument(errorMessage);
    }
    else
    {
        return coordinateToIndex(coordinate);
    }
}